

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# check_run.c
# Opt level: O0

int srunner_run_unchecked_setup(SRunner *sr,TCase *tc)

{
  fork_status fstat;
  TestResult *tr_00;
  int local_24;
  int rval;
  TestResult *tr;
  TCase *tc_local;
  SRunner *sr_local;
  
  local_24 = 1;
  set_fork_status(CK_NOFORK);
  tr_00 = srunner_run_setup(tc->unch_sflst,CK_NOFORK,tc->name,"unchecked_setup");
  fstat = srunner_fork_status(sr);
  set_fork_status(fstat);
  if ((tr_00 != (TestResult *)0x0) && (tr_00->rtype != CK_PASS)) {
    srunner_add_failure(sr,tr_00);
    local_24 = 0;
  }
  return local_24;
}

Assistant:

static int srunner_run_unchecked_setup(SRunner * sr, TCase * tc)
{
    TestResult *tr = NULL;
    int rval = 1;

    set_fork_status(CK_NOFORK);
    tr = srunner_run_setup(tc->unch_sflst, CK_NOFORK, tc->name, "unchecked_setup");
    set_fork_status(srunner_fork_status(sr));

    if(tr != NULL && tr->rtype != CK_PASS)
    {
        srunner_add_failure(sr, tr);
        rval = 0;
    }

    return rval;
}